

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  u32 *puVar1;
  u16 *puVar2;
  Bitmask *pBVar3;
  byte bVar4;
  byte bVar5;
  u8 uVar6;
  byte bVar7;
  ushort uVar8;
  undefined2 uVar9;
  Parse *pParse;
  sqlite3 *db;
  sqlite3 *psVar10;
  Select *pSVar11;
  SrcList *pSVar12;
  WhereInfo *pWVar13;
  Parse *pParse_00;
  _func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *p_Var14;
  Vdbe *p;
  char cVar15;
  char cVar16;
  u16 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  Bitmask BVar23;
  Bitmask BVar24;
  Bitmask BVar25;
  Expr *pEVar26;
  Expr *pEVar27;
  CollSeq *pCVar28;
  FuncDef *pFVar29;
  sqlite3_value *pVal;
  byte *pbVar30;
  WhereOrInfo *pWC_00;
  WhereMaskSet *pMaskSet;
  ulong uVar31;
  WhereOrInfo *pWC_01;
  WhereTerm *pWVar32;
  WhereTerm *pWVar33;
  VTable *pVVar34;
  Expr *pEVar35;
  Expr *pEVar36;
  Expr *pEVar37;
  VdbeOp *pVVar38;
  ExprList *pEVar39;
  byte bVar40;
  byte bVar41;
  long lVar42;
  u8 aff;
  uint uVar43;
  ulong uVar44;
  int *piVar45;
  long lVar46;
  ulong uVar47;
  WhereMaskSet *pMaskSet_00;
  ExprList_item *pEVar48;
  short sVar49;
  char *pcVar50;
  Expr *pLeft;
  WhereTerm *pWVar51;
  ushort uVar52;
  bool bVar53;
  bool bVar54;
  WhereTerm *local_b8;
  int aiCurCol [2];
  ulong local_48;
  void *local_38;
  
  pParse = pWC->pWInfo->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pMaskSet_00 = &pWC->pWInfo->sMaskSet;
  pEVar37 = pWC->a[idxTerm].pExpr;
  local_b8 = pWC->a + idxTerm;
  BVar23 = sqlite3WhereExprUsage(pMaskSet_00,pEVar37->pLeft);
  uVar43 = (uint)pEVar37->op;
  if (uVar43 == 0x32) {
    local_b8->prereqRight = 0;
  }
  else if (pEVar37->op == 0x31) {
    iVar18 = sqlite3ExprCheckIN(pParse,pEVar37);
    if (iVar18 != 0) {
      return;
    }
    if ((pEVar37->flags & 0x800) == 0) {
      BVar24 = sqlite3WhereExprListUsage(pMaskSet_00,(pEVar37->x).pList);
    }
    else {
      BVar24 = exprSelectUsage(pMaskSet_00,(Select *)(pEVar37->x).pList);
    }
    local_b8->prereqRight = BVar24;
  }
  else {
    BVar24 = sqlite3WhereExprUsage(pMaskSet_00,pEVar37->pRight);
    local_b8->prereqRight = BVar24;
  }
  pMaskSet_00->bVarSelect = 0;
  BVar24 = sqlite3WhereExprUsageNN(pMaskSet_00,pEVar37);
  if (pMaskSet_00->bVarSelect != 0) {
    pbVar30 = (byte *)((long)&local_b8->wtFlags + 1);
    *pbVar30 = *pbVar30 | 0x10;
  }
  if ((pEVar37->flags & 1) == 0) {
    local_48 = 0;
  }
  else {
    BVar25 = sqlite3WhereGetMask(pMaskSet_00,(int)pEVar37->iRightJoinTable);
    BVar24 = BVar24 | BVar25;
    if (BVar25 <= BVar24 >> 1) {
      sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
      return;
    }
    local_48 = BVar25 - 1;
  }
  local_b8->prereqAll = BVar24;
  local_b8->iParent = -1;
  local_b8->leftCursor = -1;
  local_b8->eOperator = 0;
  if ((uVar43 < 0x3a) && ((0x3e6200000000000U >> ((ulong)uVar43 & 0x3f) & 1) != 0)) {
    pEVar26 = sqlite3ExprSkipCollate(pEVar37->pLeft);
    pEVar27 = sqlite3ExprSkipCollate(pEVar37->pRight);
    uVar52 = 0x800;
    if ((local_b8->prereqRight & BVar23) == 0) {
      uVar52 = 0x1fff;
    }
    if (0 < local_b8->iField) {
      pEVar26 = ((pEVar26->x).pList)->a[local_b8->iField - 1].pExpr;
    }
    iVar18 = exprMightBeIndexed(pSrc,BVar23,aiCurCol,pEVar26,uVar43);
    if (iVar18 != 0) {
      local_b8->leftCursor = aiCurCol[0];
      (local_b8->u).leftColumn = aiCurCol[1];
      uVar17 = operatorMask(uVar43);
      local_b8->eOperator = uVar17 & uVar52;
    }
    if (uVar43 == 0x2d) {
      pbVar30 = (byte *)((long)&local_b8->wtFlags + 1);
      *pbVar30 = *pbVar30 | 8;
    }
    if ((pEVar27 != (Expr *)0x0) &&
       (iVar18 = exprMightBeIndexed(pSrc,local_b8->prereqRight,aiCurCol,pEVar27,uVar43), iVar18 != 0
       )) {
      if (local_b8->leftCursor < 0) {
        sVar49 = 0;
        pEVar26 = pEVar37;
        pWVar51 = local_b8;
      }
      else {
        pEVar26 = sqlite3ExprDup(db,pEVar37,0);
        if (db->mallocFailed != '\0') {
          sqlite3ExprDelete(db,pEVar26);
          return;
        }
        iVar18 = whereClauseInsert(pWC,pEVar26,3);
        if (iVar18 == 0) {
          return;
        }
        local_b8 = pWC->a + iVar18;
        markTermAsChild(pWC,iVar18,idxTerm);
        if (uVar43 == 0x2d) {
          pbVar30 = (byte *)((long)&local_b8->wtFlags + 1);
          *pbVar30 = *pbVar30 | 8;
        }
        pWVar51 = pWC->a;
        puVar2 = &pWVar51[idxTerm].wtFlags;
        *puVar2 = *puVar2 | 8;
        pWVar51 = pWVar51 + idxTerm;
        if (((pParse->db->dbOptFlags & 0x80) == 0) &&
           (((pEVar26->op == '5' || (pEVar26->op == '-')) && ((pEVar26->flags & 1) == 0)))) {
          cVar15 = sqlite3ExprAffinity(pEVar26->pLeft);
          cVar16 = sqlite3ExprAffinity(pEVar26->pRight);
          if ((cVar15 == cVar16) || ('B' < cVar16 && 'B' < cVar15)) {
            pCVar28 = sqlite3BinaryCompareCollSeq(pParse,pEVar26->pLeft,pEVar26->pRight);
            iVar18 = sqlite3IsBinary(pCVar28);
            if ((iVar18 != 0) ||
               (iVar18 = sqlite3ExprCollSeqMatch(pParse,pEVar26->pLeft,pEVar26->pRight), iVar18 != 0
               )) {
              pbVar30 = (byte *)((long)&pWVar51->eOperator + 1);
              *pbVar30 = *pbVar30 | 8;
              sVar49 = 0x800;
              goto LAB_001745a7;
            }
          }
        }
        sVar49 = 0;
      }
LAB_001745a7:
      pEVar27 = pEVar26->pLeft;
      uVar43 = pEVar26->pRight->flags;
      if (((pEVar27->flags ^ uVar43) >> 8 & 1) == 0) {
        if ((uVar43 >> 8 & 1) == 0) {
          pCVar28 = sqlite3ExprCollSeq(pParse,pEVar27);
          pEVar27 = pEVar26->pLeft;
          if (pCVar28 != (CollSeq *)0x0) {
            pbVar30 = (byte *)((long)&pEVar27->flags + 1);
            *pbVar30 = *pbVar30 | 1;
          }
        }
        else {
          pEVar26->pRight->flags = uVar43 & 0xfffffeff;
        }
      }
      pEVar36 = pEVar26->pRight;
      pEVar26->pRight = pEVar27;
      pEVar26->pLeft = pEVar36;
      if (0x35 < pEVar26->op) {
        pEVar26->op = (pEVar26->op - 0x36 ^ 2) + 0x36;
      }
      local_b8->leftCursor = aiCurCol[0];
      (local_b8->u).leftColumn = aiCurCol[1];
      local_b8->prereqRight = BVar23 | local_48;
      local_b8->prereqAll = BVar24;
      uVar17 = operatorMask((uint)pEVar26->op);
      local_b8->eOperator = sVar49 + uVar17 & uVar52;
      local_b8 = pWVar51;
    }
LAB_00174657:
    bVar41 = pEVar37->op;
  }
  else {
    bVar41 = pEVar37->op;
    if (bVar41 == 0x2b) {
      pWVar13 = pWC->pWInfo;
      pWVar51 = pWC->a;
      pParse_00 = pWVar13->pParse;
      psVar10 = pParse_00->db;
      pEVar26 = pWVar51[idxTerm].pExpr;
      pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar10,0x230);
      pWVar51[idxTerm].u.pOrInfo = pWC_00;
      if (pWC_00 != (WhereOrInfo *)0x0) {
        *(byte *)&pWVar51[idxTerm].wtFlags = (byte)pWVar51[idxTerm].wtFlags | 0x10;
        pWVar32 = (pWC_00->wc).aStatic;
        memset(pWVar32,0,0x200);
        (pWC_00->wc).pWInfo = pWVar13;
        (pWC_00->wc).hasOr = '\0';
        (pWC_00->wc).pOuter = (WhereClause *)0x0;
        (pWC_00->wc).nTerm = 0;
        (pWC_00->wc).nSlot = 8;
        (pWC_00->wc).a = pWVar32;
        sqlite3WhereSplit((WhereClause *)pWC_00,pEVar26,'+');
        sqlite3WhereExprAnalyze(pSrc,(WhereClause *)pWC_00);
        if (psVar10->mallocFailed == '\0') {
          iVar18 = (pWC_00->wc).nTerm;
          pWVar32 = (pWC_00->wc).a;
          pMaskSet = &pWVar13->sMaskSet;
          uVar47 = 0xffffffffffffffff;
          uVar44 = uVar47;
          while ((0 < iVar18 && (uVar44 != 0))) {
            uVar52 = pWVar32->eOperator;
            if ((uVar52 & 0x1ff) == 0) {
              pWC_01 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar10,0x228);
              if (pWC_01 != (WhereOrInfo *)0x0) {
                (pWVar32->u).pOrInfo = pWC_01;
                *(byte *)&pWVar32->wtFlags = (byte)pWVar32->wtFlags | 0x20;
                pWVar32->eOperator = 0x400;
                pWVar33 = (pWC_01->wc).aStatic;
                memset(pWVar33,0,0x200);
                (pWC_01->wc).pWInfo = pWC->pWInfo;
                (pWC_01->wc).hasOr = '\0';
                (pWC_01->wc).pOuter = (WhereClause *)0x0;
                (pWC_01->wc).nTerm = 0;
                (pWC_01->wc).nSlot = 8;
                (pWC_01->wc).a = pWVar33;
                sqlite3WhereSplit((WhereClause *)pWC_01,pWVar32->pExpr,',');
                sqlite3WhereExprAnalyze(pSrc,(WhereClause *)pWC_01);
                (pWC_01->wc).pOuter = pWC;
                if (psVar10->mallocFailed == '\0') {
                  iVar21 = (pWC_01->wc).nTerm;
                  if (iVar21 < 1) {
                    iVar21 = 0;
                  }
                  piVar45 = &((pWC_01->wc).a)->leftCursor;
                  uVar31 = 0;
                  while (bVar53 = iVar21 != 0, iVar21 = iVar21 + -1, bVar53) {
                    uVar47 = (ulong)((WhereTerm *)(piVar45 + -7))->pExpr->op;
                    if (((uVar47 < 0x3a) && ((0x3e6200000000000U >> (uVar47 & 0x3f) & 1) != 0)) ||
                       (*(u16 *)(piVar45 + -2) == 0x40)) {
                      BVar23 = sqlite3WhereGetMask(pMaskSet,*piVar45);
                      uVar31 = uVar31 | BVar23;
                    }
                    piVar45 = piVar45 + 0x10;
                  }
                }
                else {
                  uVar31 = 0;
                }
                uVar47 = 0;
                goto LAB_001749f6;
              }
              uVar47 = 0;
            }
            else {
              uVar8 = pWVar32->wtFlags;
              if ((uVar8 & 8) == 0) {
                uVar31 = sqlite3WhereGetMask(pMaskSet,pWVar32->leftCursor);
                if ((uVar8 & 2) != 0) {
                  BVar23 = sqlite3WhereGetMask(pMaskSet,(pWC_00->wc).a[pWVar32->iParent].leftCursor)
                  ;
                  uVar31 = uVar31 | BVar23;
                }
                uVar47 = uVar47 & uVar31;
                if ((uVar52 & 2) == 0) {
                  uVar47 = 0;
                }
LAB_001749f6:
                uVar44 = uVar44 & uVar31;
              }
            }
            iVar18 = iVar18 + -1;
            pWVar32 = pWVar32 + 1;
          }
          pWC_00->indexable = uVar44;
          pWVar51[idxTerm].eOperator = 0x200;
          if ((uVar44 != 0) && (pWC->hasOr = '\x01', (pWC_00->wc).nTerm == 2)) {
            pWVar51 = (pWC_00->wc).a;
            iVar18 = 0;
            while (pWVar32 = whereNthSubterm(pWVar51,iVar18), pWVar32 != (WhereTerm *)0x0) {
              iVar18 = iVar18 + 1;
              iVar21 = 0;
              while (pWVar33 = whereNthSubterm(pWVar51 + 1,iVar21), pWVar33 != (WhereTerm *)0x0) {
                if ((((pWVar32->eOperator & 0x3e) != 0) && ((pWVar33->eOperator & 0x3e) != 0)) &&
                   ((uVar52 = pWVar33->eOperator | pWVar32->eOperator,
                    (uVar52 & 0xffe5) == 0 || (uVar52 & 0xffd9) == 0 &&
                    (((iVar22 = sqlite3ExprCompare((Parse *)0x0,pWVar32->pExpr->pLeft,
                                                   pWVar33->pExpr->pLeft,-1), iVar22 == 0 &&
                      (iVar22 = sqlite3ExprCompare((Parse *)0x0,pWVar32->pExpr->pRight,
                                                   pWVar33->pExpr->pRight,-1), iVar22 == 0)) &&
                     (pEVar27 = sqlite3ExprDup(pWC->pWInfo->pParse->db,pWVar32->pExpr,0),
                     pEVar27 != (Expr *)0x0)))))) {
                  uVar8 = 8;
                  if ((uVar52 & 0x18) == 0) {
                    uVar8 = 0x20;
                  }
                  if ((uVar52 + 0x3f & uVar52) != 0) {
                    uVar52 = uVar8;
                  }
                  bVar41 = 0;
                  do {
                    bVar40 = bVar41;
                    bVar41 = bVar40 + 1;
                  } while (2 << (bVar40 & 0x1f) != (uint)uVar52);
                  pEVar27->op = bVar40 + 0x35;
                  iVar22 = whereClauseInsert(pWC,pEVar27,3);
                  exprAnalyze(pSrc,pWC,iVar22);
                }
                iVar21 = iVar21 + 1;
                pWVar51 = (pWC_00->wc).a;
              }
            }
          }
          if (uVar47 != 0) {
            bVar53 = false;
            iVar18 = -1;
            for (uVar43 = 0; (!bVar53 && (uVar43 < 2)); uVar43 = uVar43 + 1) {
              pWVar51 = (pWC_00->wc).a;
              iVar21 = (pWC_00->wc).nTerm;
              while( true ) {
                if (iVar21 < 1) goto LAB_0017482c;
                *(byte *)&pWVar51->wtFlags = (byte)pWVar51->wtFlags & 0xbf;
                iVar22 = pWVar51->leftCursor;
                if ((iVar22 != iVar18) &&
                   (BVar23 = sqlite3WhereGetMask(pMaskSet,iVar22), (uVar47 & BVar23) != 0)) break;
                pWVar51 = pWVar51 + 1;
                iVar21 = iVar21 + -1;
              }
              iVar18 = (pWVar51->u).leftColumn;
              pEVar27 = pWVar51->pExpr->pLeft;
              bVar53 = true;
              while ((iVar21 = iVar21 + -1, bVar53 && (-1 < iVar21))) {
                if (pWVar51->leftCursor == iVar22) {
                  bVar53 = false;
                  if ((pWVar51->u).leftColumn == iVar18) {
                    pEVar36 = pWVar51->pExpr;
                    if (iVar18 == -2) {
                      iVar19 = sqlite3ExprCompare(pParse_00,pEVar36->pLeft,pEVar27,-1);
                      if (iVar19 != 0) goto LAB_00174cc2;
                      pEVar36 = pWVar51->pExpr;
                    }
                    cVar15 = sqlite3ExprAffinity(pEVar36->pRight);
                    cVar16 = sqlite3ExprAffinity(pWVar51->pExpr->pLeft);
                    if ((cVar15 == '\0') || (cVar15 == cVar16)) {
                      *(byte *)&pWVar51->wtFlags = (byte)pWVar51->wtFlags | 0x40;
                      goto LAB_00174cbe;
                    }
                  }
                }
                else {
                  *(byte *)&pWVar51->wtFlags = (byte)pWVar51->wtFlags & 0xbf;
LAB_00174cbe:
                  bVar53 = true;
                }
LAB_00174cc2:
                pWVar51 = pWVar51 + 1;
              }
              iVar18 = iVar22;
            }
            if (bVar53) {
              pWVar51 = (pWC_00->wc).a;
              pEVar39 = (ExprList *)0x0;
              pEVar27 = (Expr *)0x0;
              for (iVar18 = (pWC_00->wc).nTerm; 0 < iVar18; iVar18 = iVar18 + -1) {
                if ((pWVar51->wtFlags & 0x40) != 0) {
                  pEVar27 = sqlite3ExprDup(psVar10,pWVar51->pExpr->pRight,0);
                  pEVar39 = sqlite3ExprListAppend(pWVar13->pParse,pEVar39,pEVar27);
                  pEVar27 = pWVar51->pExpr->pLeft;
                }
                pWVar51 = pWVar51 + 1;
              }
              pEVar27 = sqlite3ExprDup(psVar10,pEVar27,0);
              pEVar27 = sqlite3PExpr(pParse_00,0x31,pEVar27,(Expr *)0x0);
              if (pEVar27 == (Expr *)0x0) {
                sqlite3ExprListDelete(psVar10,pEVar39);
              }
              else {
                pEVar27->flags = pEVar27->flags | pEVar26->flags & 1;
                pEVar27->iRightJoinTable = pEVar26->iRightJoinTable;
                (pEVar27->x).pList = pEVar39;
                iVar18 = whereClauseInsert(pWC,pEVar27,3);
                exprAnalyze(pSrc,pWC,iVar18);
                markTermAsChild(pWC,iVar18,idxTerm);
              }
            }
          }
        }
      }
LAB_0017482c:
      local_b8 = pWC->a + idxTerm;
      goto LAB_00174657;
    }
    if ((bVar41 == 0x30) && (bVar41 = 0x30, pWC->op == ',')) {
      pEVar48 = ((pEVar37->x).pList)->a;
      for (lVar46 = 0; lVar46 != 2; lVar46 = lVar46 + 1) {
        bVar41 = "97"[lVar46];
        pEVar26 = sqlite3ExprDup(db,pEVar37->pLeft,0);
        pEVar27 = sqlite3ExprDup(db,pEVar48->pExpr,0);
        pEVar26 = sqlite3PExpr(pParse,(uint)bVar41,pEVar26,pEVar27);
        transferJoinMarkings(pEVar26,pEVar37);
        iVar18 = whereClauseInsert(pWC,pEVar26,3);
        exprAnalyze(pSrc,pWC,iVar18);
        local_b8 = pWC->a + idxTerm;
        markTermAsChild(pWC,iVar18,idxTerm);
        pEVar48 = pEVar48 + 1;
      }
      goto LAB_00174657;
    }
  }
  if (pWC->op == ',') {
    if (bVar41 == 0xa1) {
      if ((pEVar37->x).pList != (ExprList *)0x0) {
        psVar10 = pParse->db;
        iVar18 = ((pEVar37->x).pList)->nExpr;
        pFVar29 = sqlite3FindFunction(psVar10,(pEVar37->u).zToken,iVar18,'\x01','\0');
        if ((pFVar29 != (FuncDef *)0x0) && (uVar43 = pFVar29->funcFlags, (uVar43 & 4) != 0)) {
          pSVar11 = (pEVar37->x).pSelect;
          if (iVar18 < 3) {
            bVar41 = 0;
LAB_001746c3:
            pbVar30 = (byte *)pFVar29->pUserData;
            bVar40 = *pbVar30;
            bVar4 = pbVar30[1];
            bVar5 = pbVar30[2];
            pSVar12 = pSVar11->pSrc;
            pEVar26 = sqlite3ExprSkipCollate(*(Expr **)&pSVar11->op);
            uVar6 = pEVar26->op;
            if (uVar6 == 0x94) {
              if ((psVar10->flags & 0x800000) == 0) {
                sVar49 = pEVar26->iColumn;
                pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar49,aff);
                if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
                  pbVar30 = (byte *)0x0;
                }
                else {
                  pbVar30 = sqlite3_value_text(pVal);
                }
                uVar20 = 0x80000000;
                if (sVar49 < 0x20) {
                  uVar20 = 1 << ((char)sVar49 - 1U & 0x1f);
                }
                puVar1 = &pParse->pVdbe->expmask;
                *puVar1 = *puVar1 | uVar20;
                goto LAB_00174d42;
              }
LAB_00174883:
              bVar53 = true;
              pVal = (sqlite3_value *)0x0;
              pEVar27 = (Expr *)0x0;
              bVar54 = false;
            }
            else {
              if (uVar6 != 'n') goto LAB_00174883;
              pbVar30 = (byte *)(pEVar26->u).zToken;
              pVal = (sqlite3_value *)0x0;
LAB_00174d42:
              if (pbVar30 != (byte *)0x0) {
                uVar47 = 0;
                while( true ) {
                  iVar18 = (int)uVar47;
                  lVar46 = (long)iVar18;
                  bVar7 = pbVar30[lVar46];
                  if ((((bVar7 == 0) || (bVar7 == bVar40)) || (bVar7 == bVar4)) || (bVar7 == bVar5))
                  break;
                  uVar47 = lVar46 + 1;
                  if ((bVar7 == bVar41) && (pbVar30[uVar47] != 0)) {
                    uVar47 = (ulong)(iVar18 + 2);
                  }
                }
                if (((iVar18 != 0) && (pbVar30[lVar46 + -1] != 0xff)) &&
                   ((1 < iVar18 || (*pbVar30 != bVar41)))) {
                  bVar54 = false;
                  if (bVar7 == bVar40) {
                    bVar54 = pbVar30[lVar46 + 1] == 0;
                  }
                  pEVar27 = sqlite3Expr(psVar10,0x6e,(char *)pbVar30);
                  if (pEVar27 != (Expr *)0x0) {
                    pbVar30 = (byte *)(pEVar27->u).zToken;
                    pbVar30[lVar46] = 0;
                    uVar47 = 0;
                    for (iVar21 = 0; iVar21 < iVar18;
                        iVar21 = iVar21 + (uint)((int)(char)bVar40 == (uint)bVar41) + 1) {
                      bVar40 = pbVar30[iVar21];
                      pbVar30[uVar47] =
                           pbVar30[(int)(iVar21 + (uint)((int)(char)bVar40 == (uint)bVar41))];
                      uVar47 = uVar47 + 1;
                    }
                    pbVar30[uVar47 & 0xffffffff] = 0;
                    bVar41 = *pbVar30;
                    if ((((ulong)bVar41 - 0x30 < 10 || (ulong)bVar41 == 0x2d) ||
                        (uVar47 == 1 && bVar41 == 0x2f)) &&
                       (((char)pSVar12->nSrc != -0x5e ||
                        ((cVar15 = sqlite3ExprAffinity((Expr *)pSVar12), cVar15 != 'B' ||
                         (*(int *)(*(long *)&pSVar12->a[0].regResult + 0x54) != 0)))))) {
                      sqlite3ExprDeleteNN(psVar10,pEVar27);
                      sqlite3ValueFree(pVal);
                      goto LAB_00174dfb;
                    }
                  }
                  if (uVar6 == 0x94) {
                    p = pParse->pVdbe;
                    uVar9 = pEVar26->iColumn;
                    uVar20 = 0x80000000;
                    if ((short)uVar9 < 0x20) {
                      uVar20 = 1 << ((char)uVar9 - 1U & 0x1f);
                    }
                    p->expmask = p->expmask | uVar20;
                    if (bVar54) {
                      if ((pEVar26->u).zToken[1] != '\0') {
                        iVar18 = sqlite3GetTempReg(pParse);
                        sqlite3ExprCodeTarget(pParse,pEVar26,iVar18);
                        pVVar38 = sqlite3VdbeGetOp(p,p->nOp + -1);
                        pVVar38->p3 = 0;
                        if (iVar18 != 0) {
                          bVar41 = pParse->nTempReg;
                          if ((ulong)bVar41 < 8) {
                            pParse->nTempReg = bVar41 + 1;
                            pParse->aTempReg[bVar41] = iVar18;
                          }
                        }
                      }
                      bVar53 = false;
                      goto LAB_00174de8;
                    }
                    bVar54 = false;
                  }
                  bVar53 = false;
                  goto LAB_00174de8;
                }
              }
              bVar54 = false;
              pEVar27 = (Expr *)0x0;
              bVar53 = true;
            }
LAB_00174de8:
            sqlite3ValueFree(pVal);
            if (!bVar53) {
              pSVar12 = ((pEVar37->x).pSelect)->pSrc;
              pEVar26 = sqlite3ExprDup(db,pEVar27,0);
              if (((uVar43 & 8) == 0) && (pParse->db->mallocFailed == '\0')) {
                pbVar30 = (byte *)((long)&local_b8->wtFlags + 1);
                *pbVar30 = *pbVar30 | 4;
                lVar46 = 0;
                while( true ) {
                  bVar41 = (pEVar27->u).zToken[lVar46];
                  uVar47 = (ulong)bVar41;
                  if (uVar47 == 0) break;
                  (pEVar27->u).zToken[lVar46] = (~""[uVar47] | 0xdf) & bVar41;
                  (pEVar26->u).zToken[lVar46] = ""[uVar47];
                  lVar46 = lVar46 + 1;
                }
              }
              if (db->mallocFailed == '\0') {
                pcVar50 = (pEVar26->u).zToken;
                uVar20 = sqlite3Strlen30(pcVar50);
                bVar41 = pcVar50[(ulong)uVar20 - 1];
                if ((uVar43 & 8) == 0) {
                  if (bVar41 == 0x40) {
                    bVar54 = false;
                  }
                  bVar41 = ""[bVar41];
                }
                pcVar50[(ulong)uVar20 - 1] = bVar41 + 1;
              }
              pcVar50 = "BINARY";
              if ((uVar43 & 8) == 0) {
                pcVar50 = "NOCASE";
              }
              pEVar36 = sqlite3ExprDup(db,(Expr *)pSVar12,0);
              pEVar36 = sqlite3ExprAddCollateString(pParse,pEVar36,pcVar50);
              pEVar27 = sqlite3PExpr(pParse,0x39,pEVar36,pEVar27);
              transferJoinMarkings(pEVar27,pEVar37);
              iVar18 = whereClauseInsert(pWC,pEVar27,0x103);
              exprAnalyze(pSrc,pWC,iVar18);
              pEVar27 = sqlite3ExprDup(db,(Expr *)pSVar12,0);
              pEVar27 = sqlite3ExprAddCollateString(pParse,pEVar27,pcVar50);
              pEVar26 = sqlite3PExpr(pParse,0x38,pEVar27,pEVar26);
              transferJoinMarkings(pEVar26,pEVar37);
              iVar21 = whereClauseInsert(pWC,pEVar26,0x103);
              exprAnalyze(pSrc,pWC,iVar21);
              local_b8 = pWC->a + idxTerm;
              if (bVar54) {
                markTermAsChild(pWC,iVar18,idxTerm);
                markTermAsChild(pWC,iVar21,idxTerm);
              }
            }
          }
          else if ((char)pSVar11->pOrderBy->nExpr == 'n') {
            pEVar26 = pSVar11->pOrderBy->a[0].pExpr;
            bVar41 = pEVar26->op;
            if ((bVar41 != 0) && (pEVar26->affinity == '\0')) goto LAB_001746c3;
          }
        }
      }
LAB_00174dfb:
      bVar41 = pEVar37->op;
      if (pWC->op != ',') goto LAB_00175438;
    }
    else {
      bVar41 = pEVar37->op;
    }
    if ((bVar41 - 0x33 < 2) || (bVar41 == 0xa0)) {
      pEVar26 = pEVar37->pLeft;
      pEVar27 = pEVar37->pRight;
      uVar43 = 0;
      if (pEVar26->op == 0xa2) {
        uVar43 = (uint)(((pEVar26->y).pTab)->nModuleArg != 0);
      }
      if (pEVar27 == (Expr *)0x0) {
        pEVar36 = (Expr *)0x0;
      }
      else {
        pEVar36 = pEVar27;
        if ((pEVar27->op == 0xa2) && (((pEVar27->y).pTab)->nModuleArg != 0)) {
          uVar43 = uVar43 + 1;
          pEVar36 = pEVar26;
          pEVar26 = pEVar27;
        }
      }
      if (bVar41 == 0xa0) {
        uVar20 = 0x45;
      }
      else if (bVar41 == 0x34) {
        uVar20 = 0x44;
      }
      else if (bVar41 == 0x33) {
        uVar20 = 0x46;
      }
      else {
        uVar20 = 0;
      }
    }
    else {
      if (((bVar41 != 0xa1) || (pEVar39 = (pEVar37->x).pList, pEVar39 == (ExprList *)0x0)) ||
         (pEVar39->nExpr != 2)) goto LAB_00174f99;
      uVar43 = 1;
      pEVar26 = *(Expr **)(pEVar39 + 1);
      if ((pEVar26->op == 0xa2) && (((pEVar26->y).pTab)->nModuleArg != 0)) {
        pcVar50 = (pEVar37->u).zToken;
        lVar46 = 0;
        do {
          lVar42 = lVar46;
          if (lVar42 + 0x10 == 0x50) goto LAB_00174f30;
          iVar18 = sqlite3StrICmp(pcVar50,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar42));
          lVar46 = lVar42 + 0x10;
        } while (iVar18 != 0);
        uVar20 = (uint)(byte)(&DAT_001facd8)[lVar42];
        pEVar36 = pEVar39->a[0].pExpr;
      }
      else {
LAB_00174f30:
        pEVar26 = pEVar39->a[0].pExpr;
        if (pEVar26->op == 0xa2) {
          if (((pEVar26->y).pTab)->nModuleArg != 0) {
            pVVar34 = sqlite3GetVTable(db,(pEVar26->y).pTab);
            p_Var14 = pVVar34->pVtab->pModule->xFindFunction;
            if ((p_Var14 !=
                 (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
               (uVar20 = (*p_Var14)(pVVar34->pVtab,2,(pEVar37->u).zToken,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)
                                    aiCurCol,&local_38), 0x95 < (int)uVar20)) {
              pEVar36 = *(Expr **)(pEVar39 + 1);
              goto LAB_00174fac;
            }
          }
LAB_00174f99:
          uVar20 = 0;
          uVar43 = 0;
          pEVar36 = (Expr *)0x0;
          pEVar26 = (Expr *)0x0;
        }
        else {
          uVar20 = 0;
          uVar43 = 0;
          pEVar36 = (Expr *)0x0;
          pEVar26 = (Expr *)0x0;
        }
      }
    }
LAB_00174fac:
    while (pEVar27 = pEVar26, pEVar26 = pEVar36, 0 < (int)uVar43) {
      uVar43 = uVar43 - 1;
      BVar23 = sqlite3WhereExprUsage(pMaskSet_00,pEVar26);
      BVar24 = sqlite3WhereExprUsage(pMaskSet_00,pEVar27);
      pEVar36 = pEVar27;
      if ((BVar24 & BVar23) == 0) {
        pEVar35 = sqlite3ExprDup(db,pEVar26,0);
        pEVar35 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar35);
        if (((pEVar37->flags & 1) != 0) && (pEVar35 != (Expr *)0x0)) {
          *(byte *)&pEVar35->flags = (byte)pEVar35->flags | 1;
        }
        iVar18 = whereClauseInsert(pWC,pEVar35,3);
        pWVar51 = pWC->a;
        pWVar51[iVar18].prereqRight = BVar23;
        pWVar51[iVar18].leftCursor = pEVar27->iTable;
        *(int *)&pWVar51[iVar18].u = (int)pEVar27->iColumn;
        pWVar51[iVar18].eOperator = 0x40;
        pWVar51[iVar18].eMatchOp = (u8)uVar20;
        markTermAsChild(pWC,iVar18,idxTerm);
        pWVar32 = pWC->a;
        pWVar32[idxTerm].wtFlags = pWVar32[idxTerm].wtFlags | 8;
        local_b8 = pWVar32 + idxTerm;
        pWVar51[iVar18].prereqAll = pWVar32[idxTerm].prereqAll;
      }
    }
    bVar41 = pEVar37->op;
    if (pWC->op == ',') {
      if ((bVar41 == 0x35) || (bVar41 == 0x2d)) {
        pEVar26 = pEVar37->pLeft;
        iVar18 = sqlite3ExprVectorSize(pEVar26);
        if (1 < iVar18) {
          pEVar27 = pEVar37->pRight;
          iVar21 = sqlite3ExprVectorSize(pEVar27);
          if ((iVar21 == iVar18) &&
             (((pEVar26->flags & 0x800) == 0 || ((pEVar27->flags & 0x800) == 0)))) {
            for (iVar21 = 0; iVar18 != iVar21; iVar21 = iVar21 + 1) {
              pEVar26 = sqlite3ExprForVectorField(pParse,pEVar37->pLeft,iVar21);
              pEVar27 = sqlite3ExprForVectorField(pParse,pEVar37->pRight,iVar21);
              pEVar26 = sqlite3PExpr(pParse,(uint)pEVar37->op,pEVar26,pEVar27);
              transferJoinMarkings(pEVar26,pEVar37);
              iVar22 = whereClauseInsert(pWC,pEVar26,1);
              exprAnalyze(pSrc,pWC,iVar22);
            }
            local_b8 = pWC->a;
            local_b8[idxTerm].wtFlags = local_b8[idxTerm].wtFlags | 6;
            local_b8[idxTerm].eOperator = 0;
            bVar41 = pEVar37->op;
            if (pWC->op != ',') goto LAB_00175438;
            local_b8 = local_b8 + idxTerm;
          }
        }
      }
      if (bVar41 == 0x31) {
        if (((local_b8->iField != 0) || (pEVar26 = pEVar37->pLeft, pEVar26->op != 0xa9)) ||
           (((pEVar37->x).pSelect)->pPrior != (Select *)0x0)) goto LAB_00175516;
        for (iVar18 = 1; iVar21 = sqlite3ExprVectorSize(pEVar26), iVar18 + -1 < iVar21;
            iVar18 = iVar18 + 1) {
          iVar21 = whereClauseInsert(pWC,pEVar37,2);
          pWC->a[iVar21].iField = iVar18;
          exprAnalyze(pSrc,pWC,iVar21);
          markTermAsChild(pWC,iVar21,idxTerm);
          pEVar26 = pEVar37->pLeft;
        }
        bVar41 = pEVar37->op;
      }
    }
  }
LAB_00175438:
  if (((bVar41 == 0x33) && (pEVar26 = pEVar37->pLeft, pEVar26->op == 0xa2)) &&
     ((-1 < pEVar26->iColumn && (((pEVar37->flags & 1) == 0 && ((db->dbOptFlags & 0x800) == 0))))))
  {
    pEVar37 = sqlite3ExprDup(db,pEVar26,0);
    pEVar27 = sqlite3ExprAlloc(db,0x72,(Token *)0x0,0);
    pEVar37 = sqlite3PExpr(pParse,0x36,pEVar37,pEVar27);
    iVar18 = whereClauseInsert(pWC,pEVar37,0x83);
    if (iVar18 != 0) {
      pWVar51 = pWC->a;
      pWVar51[iVar18].prereqRight = 0;
      pWVar51[iVar18].leftCursor = pEVar26->iTable;
      *(int *)&pWVar51[iVar18].u = (int)pEVar26->iColumn;
      pWVar51[iVar18].eOperator = 4;
      markTermAsChild(pWC,iVar18,idxTerm);
      pWVar32 = pWC->a;
      puVar2 = &pWVar32[idxTerm].wtFlags;
      *puVar2 = *puVar2 | 8;
      pWVar51[iVar18].prereqAll = pWVar32[idxTerm].prereqAll;
    }
  }
LAB_00175516:
  pBVar3 = &pWC->a[idxTerm].prereqRight;
  *pBVar3 = *pBVar3 | local_48;
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}